

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

void __thiscall
phosg::InverseTerminalGuard::InverseTerminalGuard
          (InverseTerminalGuard *this,function<void_(const_void_*,_unsigned_long)> *write_data,
          bool active)

{
  undefined7 in_register_00000011;
  string e;
  
  ::std::function<void_(const_void_*,_unsigned_long)>::function(&this->write_data,write_data);
  this->active = active;
  if ((int)CONCAT71(in_register_00000011,active) != 0) {
    format_color_escape_abi_cxx11_(&e,INVERSE,0xffffffffffffffff);
    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
              (&this->write_data,e._M_dataplus._M_p,e._M_string_length);
    ::std::__cxx11::string::~string((string *)&e);
  }
  return;
}

Assistant:

InverseTerminalGuard(function<void(const void*, size_t)> write_data, bool active = true)
      : write_data(write_data),
        active(active) {
    if (this->active) {
      string e = format_color_escape(TerminalFormat::INVERSE, TerminalFormat::END);
      this->write_data(e.data(), e.size());
    }
  }